

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cc
# Opt level: O0

void __thiscall Message::~Message(Message *this)

{
  code *pcVar1;
  Message *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~Message() = default;